

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# property.cpp
# Opt level: O1

void __thiscall QMakeProperty::reload(QMakeProperty *this)

{
  char *pcVar1;
  byte bVar2;
  int iVar3;
  Entry *pEVar4;
  uchar *puVar5;
  storage_type *psVar6;
  QHash<ProKey,_ProString> *this_00;
  storage_type *psVar7;
  uint i;
  long lVar8;
  long in_FS_OFFSET;
  QByteArrayView QVar9;
  QStringBuilder<QString_&,_const_char_(&)[5]> local_110;
  QString local_100;
  ProString local_e8;
  QString local_b8;
  ProString local_98;
  QString local_68;
  TryEmplaceResult local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QMakeLibraryInfo::reload();
  this_00 = &this->m_values;
  lVar8 = 0;
  do {
    local_68.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_68.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_68.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    if (propList[lVar8].name == (char *)0x0) {
      psVar7 = (storage_type *)0x0;
    }
    else {
      psVar6 = (storage_type *)0xffffffffffffffff;
      do {
        psVar7 = psVar6 + 1;
        pcVar1 = psVar6 + (long)(propList[lVar8].name + 1);
        psVar6 = psVar7;
      } while (*pcVar1 != '\0');
    }
    QVar9.m_data = psVar7;
    QVar9.m_size = (qsizetype)&local_68;
    QString::fromLatin1(QVar9);
    if (propList[lVar8].singular == false) {
      iVar3 = propList[lVar8].loc;
      QMakeLibraryInfo::rawLocation(&local_b8,iVar3,EffectiveSourcePaths);
      ProString::ProString(&local_98,&local_b8);
      local_100.d.d = (Data *)&local_68;
      local_100.d.ptr = L"/src";
      ProString::ProString<QString&,char_const(&)[5]>
                (&local_e8,(QStringBuilder<QString_&,_const_char_(&)[5]> *)&local_100);
      QHash<ProKey,ProString>::tryEmplace_impl<ProKey_const&>(&local_50,this_00,(ProKey *)&local_e8)
      ;
      pEVar4 = (local_50.iterator.i.d)->spans[local_50.iterator.i.bucket >> 7].entries;
      bVar2 = (local_50.iterator.i.d)->spans[local_50.iterator.i.bucket >> 7].offsets
              [(uint)local_50.iterator.i.bucket & 0x7f];
      QString::operator=((QString *)((pEVar4->storage).data + (ulong)((uint)bVar2 * 0x60) + 0x30),
                         (QString *)&local_98);
      *(size_t *)((pEVar4->storage).data + (ulong)((uint)bVar2 * 0x60) + 0x58) = local_98.m_hash;
      *(ulong *)((pEVar4->storage).data + (ulong)((uint)bVar2 * 0x60) + 0x48) =
           CONCAT44(local_98.m_length,local_98.m_offset);
      *(ulong *)((pEVar4->storage).data + (ulong)((uint)bVar2 * 0x60) + 0x50) =
           CONCAT44(local_98._36_4_,local_98.m_file);
      if (&(local_e8.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_e8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_e8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
             + -1;
        UNLOCK();
        if (((local_e8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
            == 0) {
          QArrayData::deallocate(&(local_e8.m_string.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (&(local_98.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
             + -1;
        UNLOCK();
        if (((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
            == 0) {
          QArrayData::deallocate(&(local_98.m_string.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (&(local_b8.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_b8.d.d)->super_QArrayData,2,0x10);
        }
      }
      QMakeLibraryInfo::rawLocation(&local_b8,iVar3,EffectivePaths);
      ProString::ProString(&local_98,&local_b8);
      local_100.d.d = (Data *)&local_68;
      local_100.d.ptr = L"/get";
      ProString::ProString<QString&,char_const(&)[5]>
                (&local_e8,(QStringBuilder<QString_&,_const_char_(&)[5]> *)&local_100);
      QHash<ProKey,ProString>::tryEmplace_impl<ProKey_const&>(&local_50,this_00,(ProKey *)&local_e8)
      ;
      pEVar4 = (local_50.iterator.i.d)->spans[local_50.iterator.i.bucket >> 7].entries;
      bVar2 = (local_50.iterator.i.d)->spans[local_50.iterator.i.bucket >> 7].offsets
              [(uint)local_50.iterator.i.bucket & 0x7f];
      QString::operator=((QString *)((pEVar4->storage).data + (ulong)((uint)bVar2 * 0x60) + 0x30),
                         (QString *)&local_98);
      *(size_t *)((pEVar4->storage).data + (ulong)((uint)bVar2 * 0x60) + 0x58) = local_98.m_hash;
      *(ulong *)((pEVar4->storage).data + (ulong)((uint)bVar2 * 0x60) + 0x48) =
           CONCAT44(local_98.m_length,local_98.m_offset);
      *(ulong *)((pEVar4->storage).data + (ulong)((uint)bVar2 * 0x60) + 0x50) =
           CONCAT44(local_98._36_4_,local_98.m_file);
      if (&(local_e8.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_e8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_e8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
             + -1;
        UNLOCK();
        if (((local_e8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
            == 0) {
          QArrayData::deallocate(&(local_e8.m_string.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (&(local_98.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
             + -1;
        UNLOCK();
        if (((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
            == 0) {
          QArrayData::deallocate(&(local_98.m_string.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (&(local_b8.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_b8.d.d)->super_QArrayData,2,0x10);
        }
      }
    }
    local_b8.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_b8.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_b8.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    iVar3 = propList[lVar8].loc;
    QMakeLibraryInfo::rawLocation(&local_b8,iVar3,FinalPaths);
    if (propList[lVar8].raw == false) {
      QMakeLibraryInfo::rawLocation(&local_100,iVar3,DevicePaths);
      ProString::ProString(&local_98,&local_100);
      local_110.a = &local_68;
      local_110.b = (char (*) [5])0x2b5c20;
      ProString::ProString<QString&,char_const(&)[5]>(&local_e8,&local_110);
      QHash<ProKey,ProString>::tryEmplace_impl<ProKey_const&>(&local_50,this_00,(ProKey *)&local_e8)
      ;
      pEVar4 = (local_50.iterator.i.d)->spans[local_50.iterator.i.bucket >> 7].entries;
      bVar2 = (local_50.iterator.i.d)->spans[local_50.iterator.i.bucket >> 7].offsets
              [(uint)local_50.iterator.i.bucket & 0x7f];
      QString::operator=((QString *)((pEVar4->storage).data + (ulong)((uint)bVar2 * 0x60) + 0x30),
                         (QString *)&local_98);
      *(size_t *)((pEVar4->storage).data + (ulong)((uint)bVar2 * 0x60) + 0x58) = local_98.m_hash;
      *(ulong *)((pEVar4->storage).data + (ulong)((uint)bVar2 * 0x60) + 0x48) =
           CONCAT44(local_98.m_length,local_98.m_offset);
      *(ulong *)((pEVar4->storage).data + (ulong)((uint)bVar2 * 0x60) + 0x50) =
           CONCAT44(local_98._36_4_,local_98.m_file);
      if (&(local_e8.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_e8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_e8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
             + -1;
        UNLOCK();
        if (((local_e8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
            == 0) {
          QArrayData::deallocate(&(local_e8.m_string.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (&(local_98.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
             + -1;
        UNLOCK();
        if (((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
            == 0) {
          QArrayData::deallocate(&(local_98.m_string.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (&(local_100.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_100.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_100.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_100.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_100.d.d)->super_QArrayData,2,0x10);
        }
      }
      QMakeLibraryInfo::path(&local_100,iVar3);
      ProString::ProString(&local_98,&local_100);
      ProKey::ProKey((ProKey *)&local_e8,&local_68);
      QHash<ProKey,ProString>::tryEmplace_impl<ProKey_const&>(&local_50,this_00,(ProKey *)&local_e8)
      ;
      pEVar4 = (local_50.iterator.i.d)->spans[local_50.iterator.i.bucket >> 7].entries;
      bVar2 = (local_50.iterator.i.d)->spans[local_50.iterator.i.bucket >> 7].offsets
              [(uint)local_50.iterator.i.bucket & 0x7f];
      QString::operator=((QString *)((pEVar4->storage).data + (ulong)((uint)bVar2 * 0x60) + 0x30),
                         (QString *)&local_98);
      *(size_t *)((pEVar4->storage).data + (ulong)((uint)bVar2 * 0x60) + 0x58) = local_98.m_hash;
      *(int *)((pEVar4->storage).data + (ulong)((uint)bVar2 * 0x60) + 0x48) = local_98.m_offset;
      *(int *)((pEVar4->storage).data + (ulong)((uint)bVar2 * 0x60) + 0x4c) = local_98.m_length;
      *(int *)((pEVar4->storage).data + (ulong)((uint)bVar2 * 0x60) + 0x50) = local_98.m_file;
      puVar5 = (pEVar4->storage).data + (ulong)((uint)bVar2 * 0x60) + 0x54;
      puVar5[0] = local_98._36_1_;
      puVar5[1] = local_98._37_1_;
      puVar5[2] = local_98._38_1_;
      puVar5[3] = local_98._39_1_;
      if (&(local_e8.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_e8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_e8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
             + -1;
        UNLOCK();
        if (((local_e8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
            == 0) {
          QArrayData::deallocate(&(local_e8.m_string.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (&(local_98.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
             + -1;
        UNLOCK();
        if (((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
            == 0) {
          QArrayData::deallocate(&(local_98.m_string.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (&(local_100.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_100.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_100.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_100.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_100.d.d)->super_QArrayData,2,0x10);
        }
      }
      QString::append(&local_68,"/raw",4);
    }
    ProString::ProString(&local_98,&local_b8);
    ProKey::ProKey((ProKey *)&local_e8,&local_68);
    QHash<ProKey,ProString>::tryEmplace_impl<ProKey_const&>(&local_50,this_00,(ProKey *)&local_e8);
    pEVar4 = (local_50.iterator.i.d)->spans[local_50.iterator.i.bucket >> 7].entries;
    bVar2 = (local_50.iterator.i.d)->spans[local_50.iterator.i.bucket >> 7].offsets
            [(uint)local_50.iterator.i.bucket & 0x7f];
    QString::operator=((QString *)((pEVar4->storage).data + (ulong)((uint)bVar2 * 0x60) + 0x30),
                       (QString *)&local_98);
    *(size_t *)((pEVar4->storage).data + (ulong)((uint)bVar2 * 0x60) + 0x58) = local_98.m_hash;
    *(ulong *)((pEVar4->storage).data + (ulong)((uint)bVar2 * 0x60) + 0x48) =
         CONCAT44(local_98.m_length,local_98.m_offset);
    *(ulong *)((pEVar4->storage).data + (ulong)((uint)bVar2 * 0x60) + 0x50) =
         CONCAT44(local_98._36_4_,local_98.m_file);
    if (&(local_e8.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_e8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_e8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
           -1;
      UNLOCK();
      if (((local_e8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
          0) {
        QArrayData::deallocate(&(local_e8.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_98.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
           -1;
      UNLOCK();
      if (((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
          0) {
        QArrayData::deallocate(&(local_98.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_b8.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_b8.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,2,0x10);
      }
    }
    lVar8 = lVar8 + 1;
  } while (lVar8 != 0x17);
  ProString::ProString(&local_98,"3.1");
  ProKey::ProKey((ProKey *)&local_e8,"QMAKE_VERSION");
  QHash<ProKey,ProString>::tryEmplace_impl<ProKey_const&>(&local_50,this_00,(ProKey *)&local_e8);
  pEVar4 = (local_50.iterator.i.d)->spans[local_50.iterator.i.bucket >> 7].entries;
  bVar2 = (local_50.iterator.i.d)->spans[local_50.iterator.i.bucket >> 7].offsets
          [(uint)local_50.iterator.i.bucket & 0x7f];
  QString::operator=((QString *)((pEVar4->storage).data + (ulong)((uint)bVar2 * 0x60) + 0x30),
                     (QString *)&local_98);
  *(size_t *)((pEVar4->storage).data + (ulong)((uint)bVar2 * 0x60) + 0x58) = local_98.m_hash;
  *(ulong *)((pEVar4->storage).data + (ulong)((uint)bVar2 * 0x60) + 0x48) =
       CONCAT44(local_98.m_length,local_98.m_offset);
  *(ulong *)((pEVar4->storage).data + (ulong)((uint)bVar2 * 0x60) + 0x50) =
       CONCAT44(local_98._36_4_,local_98.m_file);
  if (&(local_e8.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_e8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_e8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_e8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_e8.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_98.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_98.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  ProString::ProString(&local_98,"6.10.0");
  ProKey::ProKey((ProKey *)&local_e8,"QT_VERSION");
  QHash<ProKey,ProString>::tryEmplace_impl<ProKey_const&>(&local_50,this_00,(ProKey *)&local_e8);
  pEVar4 = (local_50.iterator.i.d)->spans[local_50.iterator.i.bucket >> 7].entries;
  bVar2 = (local_50.iterator.i.d)->spans[local_50.iterator.i.bucket >> 7].offsets
          [(uint)local_50.iterator.i.bucket & 0x7f];
  QString::operator=((QString *)((pEVar4->storage).data + (ulong)((uint)bVar2 * 0x60) + 0x30),
                     (QString *)&local_98);
  *(size_t *)((pEVar4->storage).data + (ulong)((uint)bVar2 * 0x60) + 0x58) = local_98.m_hash;
  *(int *)((pEVar4->storage).data + (ulong)((uint)bVar2 * 0x60) + 0x48) = local_98.m_offset;
  *(int *)((pEVar4->storage).data + (ulong)((uint)bVar2 * 0x60) + 0x4c) = local_98.m_length;
  *(int *)((pEVar4->storage).data + (ulong)((uint)bVar2 * 0x60) + 0x50) = local_98.m_file;
  puVar5 = (pEVar4->storage).data + (ulong)((uint)bVar2 * 0x60) + 0x54;
  puVar5[0] = local_98._36_1_;
  puVar5[1] = local_98._37_1_;
  puVar5[2] = local_98._38_1_;
  puVar5[3] = local_98._39_1_;
  if (&(local_e8.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_e8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_e8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_e8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_e8.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_98.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_98.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QMakeProperty::reload()
{
    QMakeLibraryInfo::reload();
    for (unsigned i = 0; i < sizeof(propList)/sizeof(propList[0]); i++) {
        QString name = QString::fromLatin1(propList[i].name);
        if (!propList[i].singular) {
            m_values[ProKey(name + "/src")] = QMakeLibraryInfo::rawLocation(
                    propList[i].loc, QMakeLibraryInfo::EffectiveSourcePaths);
            m_values[ProKey(name + "/get")] = QMakeLibraryInfo::rawLocation(
                    propList[i].loc, QMakeLibraryInfo::EffectivePaths);
        }
        QString val = QMakeLibraryInfo::rawLocation(propList[i].loc, QMakeLibraryInfo::FinalPaths);
        if (!propList[i].raw) {
            m_values[ProKey(name + "/dev")] =
                    QMakeLibraryInfo::rawLocation(propList[i].loc, QMakeLibraryInfo::DevicePaths);
            m_values[ProKey(name)] = QMakeLibraryInfo::path(propList[i].loc);
            name += "/raw";
        }
        m_values[ProKey(name)] = val;
    }
#ifdef QMAKE_VERSION_STR
    m_values["QMAKE_VERSION"] = ProString(QMAKE_VERSION_STR);
#endif
#ifdef QT_VERSION_STR
    m_values["QT_VERSION"] = ProString(QT_VERSION_STR);
#endif
}